

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  GLFWbool GVar1;
  _GLFWcursor *handle;
  char *format;
  int code;
  
  if (image == (GLFWimage *)0x0) {
    __assert_fail("image != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x343,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
  }
  if (image->pixels != (uchar *)0x0) {
    if (_glfw.initialized == 0) {
      code = 0x10001;
      format = (char *)0x0;
    }
    else {
      if ((0 < image->width) && (0 < image->height)) {
        handle = (_GLFWcursor *)_glfw_calloc(1,0x10);
        handle->next = _glfw.cursorListHead;
        _glfw.cursorListHead = handle;
        GVar1 = (*_glfw.platform.createCursor)(handle,image,xhot,yhot);
        if (GVar1 != 0) {
          return (GLFWcursor *)handle;
        }
        glfwDestroyCursor((GLFWcursor *)handle);
        return (GLFWcursor *)0x0;
      }
      format = "Invalid image dimensions for cursor";
      code = 0x10004;
    }
    _glfwInputError(code,format);
    return (GLFWcursor *)0x0;
  }
  __assert_fail("image->pixels != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                ,0x344,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    assert(image != NULL);
    assert(image->pixels != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (image->width <= 0 || image->height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image dimensions for cursor");
        return NULL;
    }

    cursor = _glfw_calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfw.platform.createCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}